

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewCDataBlock(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlChar *val_00;
  xmlNodePtr val_01;
  int local_3c;
  int local_38;
  int n_len;
  int len;
  int n_content;
  xmlChar *content;
  int n_doc;
  xmlDocPtr doc;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (content._4_4_ = 0; (int)content._4_4_ < 4; content._4_4_ = content._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlDocPtr(content._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(n_len,1);
        local_38 = gen_int(local_3c,2);
        if (val_00 != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_38) {
            local_38 = 0;
          }
        }
        val_01 = (xmlNodePtr)xmlNewCDataBlock(val,val_00,local_38);
        desret_xmlNodePtr(val_01);
        call_tests = call_tests + 1;
        des_xmlDocPtr(content._4_4_,val,0);
        des_const_xmlChar_ptr(n_len,val_00,1);
        des_int(local_3c,local_38,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)content._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewCDataBlock(void) {
    int test_ret = 0;

    int mem_base;
    xmlNodePtr ret_val;
    xmlDocPtr doc; /* the target document (optional) */
    int n_doc;
    const xmlChar * content; /* raw text content (optional) */
    int n_content;
    int len; /* size of text content */
    int n_len;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        content = gen_const_xmlChar_ptr(n_content, 1);
        len = gen_int(n_len, 2);
        if ((content != NULL) &&
            (len > xmlStrlen(BAD_CAST content)))
            len = 0;

        ret_val = xmlNewCDataBlock(doc, content, len);
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_content, content, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewCDataBlock",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_content);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}